

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
S2Builder::Graph::GetInputEdgeOrder
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Graph *this,
          vector<int,_std::allocator<int>_> *input_ids)

{
  ulong uVar1;
  int iVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  pointer piVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  int *piVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  long lVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  int iVar12;
  undefined1 auVar11 [16];
  int iVar13;
  int iVar16;
  undefined1 auVar15 [16];
  allocator_type local_29;
  undefined1 auVar14 [16];
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(input_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(input_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_29);
  auVar7 = _DAT_00245de0;
  auVar6 = _DAT_00240670;
  auVar5 = _DAT_00240660;
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    lVar10 = (long)__last._M_current - (long)__first._M_current;
    uVar1 = lVar10 - 4;
    auVar15._8_4_ = (int)uVar1;
    auVar15._0_8_ = uVar1;
    auVar15._12_4_ = (int)(uVar1 >> 0x20);
    auVar11._0_8_ = uVar1 >> 2;
    auVar11._8_8_ = auVar15._8_8_ >> 2;
    uVar8 = 0;
    auVar11 = auVar11 ^ _DAT_00240670;
    do {
      iVar13 = (int)uVar8;
      auVar14._8_4_ = iVar13;
      auVar14._0_8_ = uVar8;
      auVar14._12_4_ = (int)(uVar8 >> 0x20);
      auVar15 = (auVar14 | auVar5) ^ auVar6;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar12 && auVar11._0_4_ < auVar15._0_4_ ||
                  iVar12 < auVar15._4_4_) & 1)) {
        __first._M_current[uVar8] = iVar13;
      }
      if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
          auVar15._12_4_ <= auVar11._12_4_) {
        __first._M_current[uVar8 + 1] = iVar13 + 1;
      }
      auVar15 = (auVar14 | auVar7) ^ auVar6;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar12 && (iVar16 != iVar12 || auVar15._0_4_ <= auVar11._0_4_)) {
        __first._M_current[uVar8 + 2] = iVar13 + 2;
        __first._M_current[uVar8 + 3] = iVar13 + 3;
      }
      uVar8 = uVar8 + 4;
    } while (((uVar1 >> 2) + 4 & 0xfffffffffffffffc) != uVar8);
    lVar4 = 0x3f;
    if (lVar10 >> 2 != 0) {
      for (; (ulong)(lVar10 >> 2) >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetInputEdgeOrder(std::vector<int,std::allocator<int>>const&)const::__0>>
              (__first,__last,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:166:41)>
                )input_ids);
    if (lVar10 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetInputEdgeOrder(std::vector<int,std::allocator<int>>const&)const::__0>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:166:41)>
                  )input_ids);
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::Graph::GetInputEdgeOrder(std::vector<int,std::allocator<int>>const&)const::__0>>
                (__first,__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_graph_cc:166:41)>
                  )input_ids);
      if (__last_00._M_current != __last._M_current) {
        piVar3 = (input_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar12 = *__last_00._M_current;
          piVar9 = __last_00._M_current;
          while( true ) {
            iVar13 = piVar9[-1];
            iVar16 = piVar3[iVar12];
            iVar2 = piVar3[iVar13];
            if ((iVar2 <= iVar16) && ((iVar13 <= iVar12 || (iVar2 < iVar16)))) break;
            *piVar9 = iVar13;
            piVar9 = piVar9 + -1;
          }
          *piVar9 = iVar12;
          __last_00._M_current = __last_00._M_current + 1;
        } while (__last_00._M_current != __last._M_current);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Graph::EdgeId> Graph::GetInputEdgeOrder(
    const vector<InputEdgeId>& input_ids) const {
  vector<EdgeId> order(input_ids.size());
  std::iota(order.begin(), order.end(), 0);
  std::sort(order.begin(), order.end(), [&input_ids](EdgeId a, EdgeId b) {
      // Comparison function ensures sort is stable.
      return make_pair(input_ids[a], a) < make_pair(input_ids[b], b);
    });
  return order;
}